

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

Reply * __thiscall
i2p::sam::Session::SendRequestAndGetReply
          (Reply *__return_storage_ptr__,Session *this,Sock *sock,string *request,
          bool check_result_ok)

{
  bool bVar1;
  char *pcVar2;
  runtime_error *this_00;
  char sep;
  pointer pSVar3;
  CThreadInterrupt *args_1;
  long in_FS_OFFSET;
  _Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_> local_98;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+(&local_58,request,"\n");
  (*sock->_vptr_Sock[0x11])
            (sock,local_58._M_dataplus._M_p,local_58._M_string_length,1000,this->m_interrupt);
  std::__cxx11::string::~string((string *)&local_58);
  Reply::Reply(__return_storage_ptr__);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_78,request,0,0xe);
  bVar1 = std::operator==(&local_78,"SESSION CREATE");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"SESSION CREATE ...",&local_79);
  }
  else {
    std::__cxx11::string::string((string *)&local_58,request);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&__return_storage_ptr__->request,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  args_1 = this->m_interrupt;
  sep = ' ';
  (*sock->_vptr_Sock[0x12])(&local_58,sock,10,180000,args_1,0x10000);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&__return_storage_ptr__->full,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p = (__return_storage_ptr__->full)._M_dataplus._M_p;
  local_58._M_string_length = (__return_storage_ptr__->full)._M_string_length;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)&local_98,
             (util *)&local_58,(Span<const_char> *)0x20,sep);
  for (pSVar3 = local_98._M_impl.super__Vector_impl_data._M_start;
      pSVar3 != local_98._M_impl.super__Vector_impl_data._M_finish; pSVar3 = pSVar3 + 1) {
    local_58._M_dataplus._M_p._0_1_ = 0x3d;
    pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (pSVar3->m_data,pSVar3->m_data + pSVar3->m_size,&local_58);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    if (pcVar2 == pSVar3->m_data + pSVar3->m_size) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string,std::nullopt_t_const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&__return_storage_ptr__->keys,&local_58,&std::nullopt);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pSVar3->m_data,pcVar2);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,pcVar2 + 1,pSVar3->m_data + pSVar3->m_size);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string,std::__cxx11::string>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&__return_storage_ptr__->keys,&local_58,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base(&local_98);
  if (check_result_ok) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"RESULT",(allocator<char> *)&local_98);
    Reply::Get(&local_58,__return_storage_ptr__,&local_78);
    bVar1 = std::operator==(&local_58,"OK");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&local_58,(tinyformat *)"Unexpected reply to \"%s\": \"%s\"",(char *)request,
                 &__return_storage_ptr__->full,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      std::runtime_error::runtime_error(this_00,(string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_003cb61c;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_003cb61c:
  __stack_chk_fail();
}

Assistant:

Session::Reply Session::SendRequestAndGetReply(const Sock& sock,
                                               const std::string& request,
                                               bool check_result_ok) const
{
    sock.SendComplete(request + "\n", MAX_WAIT_FOR_IO, *m_interrupt);

    Reply reply;

    // Don't log the full "SESSION CREATE ..." because it contains our private key.
    reply.request = request.substr(0, 14) == "SESSION CREATE" ? "SESSION CREATE ..." : request;

    // It could take a few minutes for the I2P router to reply as it is querying the I2P network
    // (when doing name lookup, for example). Notice: `RecvUntilTerminator()` is checking
    // `m_interrupt` more often, so we would not be stuck here for long if `m_interrupt` is
    // signaled.
    static constexpr auto recv_timeout = 3min;

    reply.full = sock.RecvUntilTerminator('\n', recv_timeout, *m_interrupt, MAX_MSG_SIZE);

    for (const auto& kv : Split(reply.full, ' ')) {
        const auto& pos = std::find(kv.begin(), kv.end(), '=');
        if (pos != kv.end()) {
            reply.keys.emplace(std::string{kv.begin(), pos}, std::string{pos + 1, kv.end()});
        } else {
            reply.keys.emplace(std::string{kv.begin(), kv.end()}, std::nullopt);
        }
    }

    if (check_result_ok && reply.Get("RESULT") != "OK") {
        throw std::runtime_error(
            strprintf("Unexpected reply to \"%s\": \"%s\"", request, reply.full));
    }

    return reply;
}